

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::~MLMG(MLMG *this)

{
  pointer pdVar1;
  pointer piVar2;
  MultiFab *pMVar3;
  MLLinOp *pMVar4;
  
  pdVar1 = (this->m_iter_fine_resnorm0).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->m_iter_fine_resnorm0).
                                 super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  piVar2 = (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  pdVar1 = (this->timer).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->timer).super_vector<double,_std::allocator<double>_>.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->rescor).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->cor_hold).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->cor).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~vector(&(this->res).
             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           );
  piVar2 = (this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::~vector
            (&(this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::~vector
            (&(this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>);
  pMVar3 = (this->ns_rhs)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  if (pMVar3 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  (this->ns_rhs)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  pMVar3 = (this->ns_sol)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  if (pMVar3 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  (this->ns_sol)._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr(&this->ns_mlmg);
  pMVar4 = (this->ns_linop)._M_t.
           super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
           super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl;
  if (pMVar4 != (MLLinOp *)0x0) {
    (*pMVar4->_vptr_MLLinOp[1])();
  }
  (this->ns_linop)._M_t.super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
  super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl = (MLLinOp *)0x0;
  return;
}

Assistant:

MLMG::~MLMG ()
{}